

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_x,float default_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  float fVar3;
  float fVar5;
  float fVar6;
  ImVec2 IVar4;
  float fVar7;
  float fVar8;
  
  pIVar2 = GImGui;
  fVar8 = size.x;
  fVar5 = size.y;
  if (0.0 <= fVar8) {
    fVar3 = 0.0;
    fVar6 = 0.0;
    if (0.0 <= fVar5) goto LAB_0013068a;
  }
  pIVar1 = GImGui->CurrentWindow;
  IVar4 = (pIVar1->ContentsRegionRect).Max;
  fVar3 = IVar4.x;
  if ((pIVar1->DC).ColumnsCount != 1) {
    fVar3 = GetColumnOffset((pIVar1->DC).ColumnsCurrent + 1);
    fVar3 = fVar3 - (pIVar1->WindowPadding).x;
  }
  fVar3 = (pIVar1->Pos).x + fVar3;
  fVar6 = (pIVar1->Pos).y + IVar4.y;
LAB_0013068a:
  fVar7 = fVar8;
  if ((fVar8 <= 0.0) && ((fVar8 != 0.0 || (fVar7 = default_x, NAN(fVar8))))) {
    fVar3 = fVar3 - (pIVar2->CurrentWindow->DC).CursorPos.x;
    if (fVar3 <= 4.0) {
      fVar3 = 4.0;
    }
    fVar7 = fVar3 + fVar8;
  }
  fVar8 = fVar5;
  if ((fVar5 <= 0.0) && ((fVar5 != 0.0 || (fVar8 = default_y, NAN(fVar5))))) {
    fVar6 = fVar6 - (pIVar2->CurrentWindow->DC).CursorPos.y;
    if (fVar6 <= 4.0) {
      fVar6 = 4.0;
    }
    fVar8 = fVar5 + fVar6;
  }
  IVar4.y = fVar8;
  IVar4.x = fVar7;
  return IVar4;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_x, float default_y)
{
    ImGuiContext& g = *GImGui;
    ImVec2 content_max;
    if (size.x < 0.0f || size.y < 0.0f)
        content_max = g.CurrentWindow->Pos + GetContentRegionMax();
    if (size.x <= 0.0f)
        size.x = (size.x == 0.0f) ? default_x : ImMax(content_max.x - g.CurrentWindow->DC.CursorPos.x, 4.0f) + size.x;
    if (size.y <= 0.0f)
        size.y = (size.y == 0.0f) ? default_y : ImMax(content_max.y - g.CurrentWindow->DC.CursorPos.y, 4.0f) + size.y;
    return size;
}